

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackGenerator::DisplayVerboseOutput(cmCPackGenerator *this,string *msg,float progress)

{
  cmCPackLog *this_00;
  ostream *poVar1;
  char *local_1b0 [4];
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar1 = std::operator<<((ostream *)&cmCPackLog_msg,"");
  poVar1 = std::operator<<(poVar1,(string *)msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(this_00,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x33,local_1b0[0]);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  return;
}

Assistant:

void cmCPackGenerator::DisplayVerboseOutput(const std::string& msg,
                                            float progress)
{
  (void)progress;
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "" << msg << std::endl);
}